

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ShaderSharingTest::renderResource
          (GLES2ShaderSharingTest *this,Surface *screen,Surface *reference)

{
  GLsizei GVar1;
  GLsizei GVar2;
  glReadPixelsFunc p_Var3;
  uint uVar4;
  GLuint GVar5;
  GLenum GVar6;
  GLuint GVar7;
  TestError *this_00;
  int iVar8;
  uint uVar9;
  GLsizei GVar10;
  int iVar11;
  char *msg;
  int x;
  int iVar12;
  int iVar13;
  float fVar14;
  float s;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  float t;
  char *fragmentShader;
  char *vertexShader;
  float local_36c;
  int local_368;
  int local_364;
  float local_360;
  float local_35c;
  int local_358;
  GLint status;
  Surface *local_350;
  Vec4 color;
  tcu local_328 [16];
  Vector<float,_4> local_318;
  Vector<float,_4> local_308;
  Vector<float,_4> local_2f8;
  tcu local_2e8 [16];
  tcu local_2d8 [16];
  Vector<float,_4> local_2c8;
  undefined1 local_2b8 [8];
  _func_int **pp_Stack_2b0;
  void *local_298;
  char buffer [256];
  
  vertexShader = 
  "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
  ;
  fragmentShader =
       "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}\n";
  local_350 = reference;
  if (this->m_shaderType == 0x8b30) {
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.createShader)(0x8b31);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"glCreateShader()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x391);
    (*(this->super_GLES2SharingTest).m_gl.shaderSource)(GVar5,1,&vertexShader,(GLint *)0x0);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    msg = "shaderSource(otherShader, 1, &vertexShader, DE_NULL)";
    iVar8 = 0x392;
LAB_00da294a:
    glu::checkError(GVar6,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,iVar8);
  }
  else {
    if (this->m_shaderType == 0x8b31) {
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.createShader)(0x8b30);
      GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar6,"glCreateShader()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x38b);
      (*(this->super_GLES2SharingTest).m_gl.shaderSource)(GVar5,1,&fragmentShader,(GLint *)0x0);
      GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      msg = "shaderSource(otherShader, 1, &fragmentShader, DE_NULL)";
      iVar8 = 0x38c;
      goto LAB_00da294a;
    }
    GVar5 = 0xffffffff;
  }
  (*(this->super_GLES2SharingTest).m_gl.compileShader)(GVar5);
  GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar6,"compileShader(otherShader)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x399);
  status = 0;
  (*(this->super_GLES2SharingTest).m_gl.getShaderiv)(GVar5,0x8b81,&status);
  GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar6,"getShaderiv(otherShader, GL_COMPILE_STATUS, &status)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x39c);
  if (status != 0) {
    GVar7 = (*(this->super_GLES2SharingTest).m_gl.createProgram)();
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"glCreateProgram()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3b8);
    (*(this->super_GLES2SharingTest).m_gl.attachShader)(GVar7,this->m_shader);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"attachShader(program, m_shader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3ba);
    (*(this->super_GLES2SharingTest).m_gl.attachShader)(GVar7,GVar5);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"attachShader(program, otherShader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3bb);
    (*(this->super_GLES2SharingTest).m_gl.linkProgram)(GVar7);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"linkProgram(program)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3bd);
    (*(this->super_GLES2SharingTest).m_gl.deleteShader)(GVar5);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"deleteShader(otherShader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3be);
    status = 0;
    (*(this->super_GLES2SharingTest).m_gl.getProgramiv)(GVar7,0x8b82,&status);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"getProgramiv(program, GL_LINK_STATUS, &status)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3c1);
    if (status == 0) {
      (*(this->super_GLES2SharingTest).m_gl.getProgramInfoLog)(GVar7,0x100,(GLsizei *)0x0,buffer);
      GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar6,"getProgramInfoLog(program, 256, DE_NULL, buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3c6);
      local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
      std::operator<<((ostream *)&pp_Stack_2b0,"Failed to link program");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
      local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
      std::operator<<((ostream *)&pp_Stack_2b0,vertexShader);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
      local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
      std::operator<<((ostream *)&pp_Stack_2b0,fragmentShader);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
      local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
      std::operator<<((ostream *)&pp_Stack_2b0,buffer);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Failed to link program",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                 ,0x3cd);
    }
    else {
      if (screen == (Surface *)0x0) {
        iVar8 = 0xf0;
        GVar10 = 0xf0;
      }
      else {
        GVar10 = screen->m_width;
        iVar8 = screen->m_height;
      }
      (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,GVar10,iVar8);
      GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar6,"viewport(0, 0, width, height)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3e9);
      (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
      GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar6,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3eb);
      (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
      GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar6,"clear(GL_COLOR_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3ec);
      (*(this->super_GLES2SharingTest).m_gl.useProgram)(GVar7);
      GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar6,"useProgram(program)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3ee);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)(GVar7,"a_pos");
      GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar6,"glGetAttribLocation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3f1);
      if (GVar5 == 0xffffffff) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"coordLocation != (GLuint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x3f2);
      }
      else {
        GVar7 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)(GVar7,"a_color");
        GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
        glu::checkError(GVar6,"glGetAttribLocation()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                        ,0x3f5);
        if (GVar7 != 0xffffffff) {
          (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar7);
          GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar6,"enableVertexAttribArray(colorLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3f8);
          (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar5);
          GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar6,"enableVertexAttribArray(coordLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3f9);
          (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                    (GVar7,4,0x1406,'\0',0,renderResource::colors);
          GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar6,
                          "vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3fb);
          (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                    (GVar5,2,0x1406,'\0',0,renderResource::coords);
          GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar6,
                          "vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3fc);
          (*(this->super_GLES2SharingTest).m_gl.drawElements)(4,6,0x1403,renderResource::indices);
          GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar6,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3fe);
          (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar5);
          GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar6,"disableVertexAttribArray(coordLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3ff);
          (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar7);
          GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar6,"disableVertexAttribArray(colorLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x400);
          (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
          GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar6,"useProgram(0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x401);
          if (screen != (Surface *)0x0) {
            p_Var3 = (this->super_GLES2SharingTest).m_gl.readPixels;
            GVar1 = screen->m_width;
            GVar2 = screen->m_height;
            tcu::Surface::getAccess((PixelBufferAccess *)local_2b8,screen);
            (*p_Var3)(0,0,GVar1,GVar2,0x1908,0x1401,local_298);
            tcu::Surface::getAccess((PixelBufferAccess *)local_2b8,local_350);
            buffer[0] = -1;
            buffer[1] = '\0';
            buffer[2] = '\0';
            buffer[3] = '\0';
            buffer[4] = '\0';
            buffer[5] = '\0';
            buffer[6] = '\0';
            buffer[7] = '\0';
            buffer[8] = '\0';
            buffer[9] = '\0';
            buffer[10] = '\0';
            buffer[0xb] = '\0';
            buffer[0xc] = -1;
            buffer[0xd] = '\0';
            buffer[0xe] = '\0';
            buffer[0xf] = '\0';
            tcu::clear((PixelBufferAccess *)local_2b8,(IVec4 *)buffer);
            fVar14 = (float)GVar10 * 0.5;
            iVar12 = (int)(fVar14 * -0.9 + fVar14);
            local_364 = (int)(fVar14 * 0.9 + fVar14);
            fVar14 = (float)iVar8 * 0.5;
            iVar8 = (int)(fVar14 * -0.9 + fVar14);
            local_36c = (float)(local_364 - iVar12);
            local_358 = (int)(fVar14 * 0.9 + fVar14);
            local_35c = (float)(local_358 - iVar8);
            local_368 = iVar12;
            for (; iVar12 <= local_364; iVar12 = iVar12 + 1) {
              fVar14 = (float)(iVar12 - local_368) / local_36c;
              local_360 = 1.0 - fVar14;
              for (iVar13 = 0; iVar11 = iVar8 + iVar13, iVar11 <= local_358; iVar13 = iVar13 + 1) {
                s = (float)iVar13 / local_35c;
                local_2b8._0_4_ = R;
                local_2b8._4_4_ = SNORM_INT8;
                pp_Stack_2b0 = (_func_int **)0x3f80000000000000;
                buffer[0] = '\0';
                buffer[1] = '\0';
                buffer[2] = -0x80;
                buffer[3] = '?';
                buffer[4] = '\0';
                buffer[5] = '\0';
                buffer[6] = '\0';
                buffer[7] = '\0';
                buffer[8] = '\0';
                buffer[9] = '\0';
                buffer[10] = '\0';
                buffer[0xb] = '\0';
                buffer[0xc] = '\0';
                buffer[0xd] = '\0';
                buffer[0xe] = -0x80;
                buffer[0xf] = '?';
                local_318.m_data[0] = 0.0;
                local_318.m_data[1] = 1.0;
                local_318.m_data[2] = 0.0;
                local_318.m_data[3] = 1.0;
                local_308.m_data[0] = 0.0;
                local_308.m_data[1] = 0.0;
                local_308.m_data[2] = 1.0;
                local_308.m_data[3] = 1.0;
                tcu::Vector<float,_4>::Vector(&color);
                if (fVar14 <= s) {
                  tcu::operator*(local_2d8,1.0 - s,(Vector<float,_4> *)local_2b8);
                  tcu::operator*(local_2e8,s - fVar14,&local_308);
                  tcu::operator+((tcu *)&local_2c8,(Vector<float,_4> *)local_2d8,
                                 (Vector<float,_4> *)local_2e8);
                  s = fVar14;
                }
                else {
                  tcu::operator*(local_2d8,local_360,(Vector<float,_4> *)local_2b8);
                  tcu::operator*(local_2e8,fVar14 - s,(Vector<float,_4> *)buffer);
                  tcu::operator+((tcu *)&local_2c8,(Vector<float,_4> *)local_2d8,
                                 (Vector<float,_4> *)local_2e8);
                }
                tcu::operator*((tcu *)&local_2f8,s,&local_318);
                tcu::operator+(local_328,&local_2c8,&local_2f8);
                color.m_data[0] = (float)local_328._0_8_;
                color.m_data[1] = SUB84(local_328._0_8_,4);
                color.m_data[2] = (float)local_328._8_8_;
                color.m_data[3] = SUB84(local_328._8_8_,4);
                uVar15 = (uint)(color.m_data[0] * 255.0);
                uVar16 = (uint)(color.m_data[1] * 255.0);
                uVar17 = (uint)(color.m_data[2] * 255.0);
                uVar18 = (uint)(color.m_data[3] * 255.0);
                uVar4 = uVar15;
                if (0xfe < uVar15) {
                  uVar4 = 0xff;
                }
                uVar9 = uVar16;
                if (0xfe < uVar16) {
                  uVar9 = 0xff;
                }
                uVar19 = -(uint)(-0x7fffff02 < (int)(uVar17 ^ 0x80000000));
                uVar20 = -(uint)(-0x7fffff02 < (int)(uVar18 ^ 0x80000000));
                *(uint *)((long)(local_350->m_pixels).m_ptr +
                         (long)(iVar11 * local_350->m_width + iVar12) * 4) =
                     ~((int)uVar18 >> 0x1f) & (uVar20 >> 0x18 | ~uVar20 & uVar18) << 0x18 |
                     ~((int)uVar16 >> 0x1f) & uVar9 << 8 |
                     ~((int)uVar17 >> 0x1f) & (uVar19 >> 0x18 | ~uVar19 & uVar17) << 0x10 |
                     ~((int)uVar15 >> 0x1f) & uVar4;
              }
            }
          }
          return;
        }
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"colorLocation != (GLuint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x3f6);
      }
    }
    goto LAB_00da33d8;
  }
  (*(this->super_GLES2SharingTest).m_gl.getShaderInfoLog)(GVar5,0x100,(GLsizei *)0x0,buffer);
  GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar6,"getShaderInfoLog(otherShader, 256, DE_NULL, buffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x3a1);
  local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
  std::operator<<((ostream *)&pp_Stack_2b0,"Failed to compile shader");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
  if (this->m_shaderType == 0x8b30) {
    local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
    std::operator<<((ostream *)&pp_Stack_2b0,vertexShader);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00da342a:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
  }
  else if (this->m_shaderType == 0x8b31) {
    local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
    std::operator<<((ostream *)&pp_Stack_2b0,fragmentShader);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00da342a;
  }
  local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
  std::operator<<((ostream *)&pp_Stack_2b0,buffer);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to compile shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x3b4);
LAB_00da33d8:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2ShaderSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	int width = 240;
	int height = 240;

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec4 a_color;\n"
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = v_color;\n"
	"}\n";


	GLuint otherShader = (GLuint)-1;

	switch (m_shaderType)
	{
		case GL_VERTEX_SHADER:
			otherShader = m_gl.createShader(GL_FRAGMENT_SHADER);
			GLU_CHECK_GLW_MSG(m_gl, "glCreateShader()");
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(otherShader, 1, &fragmentShader, DE_NULL));
			break;

		case GL_FRAGMENT_SHADER:
			otherShader = m_gl.createShader(GL_VERTEX_SHADER);
			GLU_CHECK_GLW_MSG(m_gl, "glCreateShader()");
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(otherShader, 1, &vertexShader, DE_NULL));
			break;

		default:
			DE_ASSERT(false);
	}

	GLU_CHECK_GLW_CALL(m_gl, compileShader(otherShader));

	GLint status = 0;
	GLU_CHECK_GLW_CALL(m_gl, getShaderiv(otherShader, GL_COMPILE_STATUS, &status));

	if (!status)
	{
		char buffer[256];
		GLU_CHECK_GLW_CALL(m_gl, getShaderInfoLog(otherShader, 256, DE_NULL, buffer));

		m_log << tcu::TestLog::Message << "Failed to compile shader" << tcu::TestLog::EndMessage;

		switch (m_shaderType)
		{
			case GL_FRAGMENT_SHADER:
				m_log << tcu::TestLog::Message << vertexShader << tcu::TestLog::EndMessage;
				break;

			case GL_VERTEX_SHADER:
				m_log << tcu::TestLog::Message << fragmentShader << tcu::TestLog::EndMessage;
				break;

			default:
				DE_ASSERT(false);
		}

		m_log << tcu::TestLog::Message << buffer << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to compile shader");
	}

	GLuint program = m_gl.createProgram();
	GLU_CHECK_GLW_MSG(m_gl, "glCreateProgram()");

	GLU_CHECK_GLW_CALL(m_gl, attachShader(program, m_shader));
	GLU_CHECK_GLW_CALL(m_gl, attachShader(program, otherShader));

	GLU_CHECK_GLW_CALL(m_gl, linkProgram(program));
	GLU_CHECK_GLW_CALL(m_gl, deleteShader(otherShader));

	status = 0;
	GLU_CHECK_GLW_CALL(m_gl, getProgramiv(program, GL_LINK_STATUS, &status));

	if (!status)
	{
		char buffer[256];
		GLU_CHECK_GLW_CALL(m_gl, getProgramInfoLog(program, 256, DE_NULL, buffer));

		m_log << tcu::TestLog::Message << "Failed to link program" << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << vertexShader << tcu::TestLog::EndMessage;
		m_log << tcu::TestLog::Message << fragmentShader << tcu::TestLog::EndMessage;
		m_log << tcu::TestLog::Message << buffer << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to link program");
	}

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-0.9f, -0.9f,
		 0.9f, -0.9f,
		 0.9f,  0.9f,
		-0.9f,  0.9f
	};

	static const GLfloat colors [] = {
		0.0f, 0.0f, 0.0f, 1.0f,
		1.0f, 0.0f, 0.0f, 1.0f,
		0.0f, 1.0f, 0.0f, 1.0f,
		0.0f, 0.0f, 1.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program));

	GLuint coordLocation = m_gl.getAttribLocation(program, "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(program, "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));

		int x1 = (int)(((float)width/2.0f)  * (-0.9f) + ((float)width/2.0f));
		int x2 = (int)(((float)width/2.0f)  *   0.9f  + ((float)width/2.0f));
		int y1 = (int)(((float)height/2.0f) * (-0.9f) + ((float)height/2.0f));
		int y2 = (int)(((float)height/2.0f) *   0.9f  + ((float)height/2.0f));

		for (int x = x1; x <= x2; x++)
		{
			for (int y = y1; y <= y2; y++)
			{
				float t = ((float)(x-x1) / (float)(x2-x1));
				float s = ((float)(y-y1) / (float)(y2-y1));
				bool isUpper = t > s;

				tcu::Vec4 a(colors[0],		colors[1],		colors[2],		colors[3]);
				tcu::Vec4 b(colors[4 + 0],	colors[4 + 1],	colors[4 + 2],	colors[4 + 3]);
				tcu::Vec4 c(colors[8 + 0],	colors[8 + 1],	colors[8 + 2],	colors[8 + 3]);
				tcu::Vec4 d(colors[12 + 0],	colors[12 + 1],	colors[12 + 2],	colors[12 + 3]);


				tcu::Vec4 color;

				if (isUpper)
					color = a * (1.0f - t)  + b * (t - s) + s * c;
				else
					color = a * (1.0f - s)  + d * (s - t) + t * c;

				int red		= deClamp32((int)(255.0f * color.x()), 0, 255);
				int green	= deClamp32((int)(255.0f * color.y()), 0, 255);
				int blue	= deClamp32((int)(255.0f * color.z()), 0, 255);
				int alpha	= deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(red, green, blue, alpha));
			}
		}
	}
}